

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O0

err_t cvrExtr(int argc,char **argv)

{
  char *str;
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *sig_len_00;
  undefined8 *in_RSI;
  int in_EDI;
  size_t cert_len;
  size_t offset;
  octet *certs;
  size_t ring_len;
  cmd_sig_t *sig;
  size_t sig_len;
  void *stack;
  size_t num;
  char *scope;
  err_t code;
  char *in_stack_ffffffffffffff98;
  cmd_sig_t *size;
  char **in_stack_ffffffffffffffa8;
  size_t *in_stack_ffffffffffffffb0;
  cmd_sig_t *in_stack_ffffffffffffffb8;
  size_t *cert_len_00;
  size_t *in_stack_ffffffffffffffc8;
  err_t local_4;
  
  str = (char *)*in_RSI;
  if ((in_EDI == 3) && (bVar1 = strStartsWith(str,"-cert"), bVar1 != 0)) {
    sVar2 = strLen((char *)0x111dc0);
    bVar1 = decIsValid(in_stack_ffffffffffffff98);
    if ((bVar1 == 0) ||
       ((sVar3 = strLen((char *)0x111de3), sVar3 == 0 ||
        (sVar3 = strLen((char *)0x111df3), 8 < sVar3)))) {
      local_4 = 0x25b;
    }
    else {
      decToU32(str + sVar2);
      local_4 = cmdFileValExist((int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if ((local_4 == 0) &&
         ((local_4 = cmdFileValNotExist((int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8),
          local_4 == 0 &&
          (local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                    (char *)in_stack_ffffffffffffffa8), local_4 == 0)))) {
        size = in_stack_ffffffffffffffb8;
        if (in_stack_ffffffffffffffb8 < (cmd_sig_t *)0x630) {
          size = (cmd_sig_t *)0x630;
        }
        sig_len_00 = (size_t *)blobCreate((size_t)size);
        local_4 = 0x6e;
        if (sig_len_00 != (size_t *)0x0) {
          local_4 = 0;
        }
        if (local_4 == 0) {
          cert_len_00 = sig_len_00;
          local_4 = cmdSigRead(in_stack_ffffffffffffffb8,sig_len_00,
                               (char *)in_stack_ffffffffffffffa8);
          if (local_4 == 0) {
            local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,sig_len_00,
                                     (char *)in_stack_ffffffffffffffa8);
            if (local_4 == 0) {
              local_4 = cmdCVCsGet(in_stack_ffffffffffffffc8,cert_len_00,
                                   in_stack_ffffffffffffffb8->sig,(size_t)sig_len_00,
                                   (size_t)in_stack_ffffffffffffffa8);
              if (local_4 == 0) {
                local_4 = cmdFileWrite((char *)in_stack_ffffffffffffffb8,sig_len_00,
                                       (size_t)in_stack_ffffffffffffffa8);
                blobClose((blob_t)0x111fe5);
              }
              else {
                blobClose((blob_t)0x111fb0);
              }
            }
            else {
              blobClose((blob_t)0x111f6e);
            }
          }
          else {
            blobClose((blob_t)0x111f34);
          }
        }
      }
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t cvrExtr(int argc, char* argv[])
{
	err_t code;
	const char* scope;
	size_t num;
	void* stack;
	size_t sig_len;
	cmd_sig_t* sig;
	size_t ring_len;
	octet* certs;
	size_t offset;
	size_t cert_len;
	// обработать опции
	scope = argv[0];
	if (argc != 3 || !strStartsWith(scope, "-cert"))
		return ERR_CMD_PARAMS;
	scope += strLen("-cert");
	// определить номер сертификата
	if (!decIsValid(scope) || strLen(scope) < 1 || strLen(scope) > 8)
		return ERR_CMD_PARAMS;
	num = (size_t)decToU32(scope);
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv + 1);
	ERR_CALL_CHECK(code);
	code = cmdFileValNotExist(1, argv + 2);
	ERR_CALL_CHECK(code);
	// определить длину кольца
	code = cmdFileReadAll(0, &ring_len, argv[1]);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, MAX2(sizeof(cmd_sig_t), ring_len));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	certs = (octet*)stack;
	// определить длину подписи
	code = cmdSigRead(sig, &sig_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// прочитать кольцо
	code = cmdFileReadAll(certs, &ring_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// найти сертификат
	code = cmdCVCsGet(&offset, &cert_len, certs, ring_len - sig_len, num);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// записать сертификат в файл
	code = cmdFileWrite(argv[2], certs + offset, cert_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}